

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::json_const_reference_storage>
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> *this,
          basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *other)

{
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> bVar1;
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> bVar2;
  json_const_reference_storage jVar3;
  half_storage hVar4;
  int64_t iVar5;
  undefined8 uVar6;
  int64_t iVar7;
  common_storage cVar8;
  ulong uVar9;
  bool_storage temp;
  undefined4 auStack_cc [3];
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> *pbStack_c0;
  undefined4 auStack_8c [5];
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> *pbStack_78;
  undefined4 auStack_44 [5];
  
  bVar1 = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> *)&other->field_0;
  switch((byte)bVar1 & 0xf) {
  case 0:
  case 4:
    cVar8 = (other->field_0).common_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    goto LAB_005bdad0;
  case 1:
    bVar1 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
            (other->field_0).boolean_.val_;
    cVar8 = (other->field_0).common_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    this[2] = bVar1;
LAB_005bdad0:
    *(common_storage *)this = cVar8;
    break;
  default:
    uVar6 = *(undefined8 *)&other->field_0;
    iVar5 = (other->field_0).int64_.val_;
    iVar7 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar7;
    *(undefined8 *)this = uVar6;
    *(int64_t *)(this + 8) = iVar5;
    break;
  case 6:
    hVar4 = (other->field_0).half_float_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    *(half_storage *)this = hVar4;
    break;
  case 7:
    bVar2 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
            (other->field_0).common_.tag_;
    uVar9 = (ulong)((byte)bVar1 >> 2 & 0xfffffffc);
    memcpy(auStack_44,(void *)((long)&other->field_0 + 4),uVar9);
    auStack_44[(byte)bVar1 >> 4] = 0;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    *this = bVar1;
    this[1] = bVar2;
    memcpy(this + 4,auStack_44,uVar9);
    *(undefined4 *)(this + (ulong)((byte)bVar1 >> 4) * 4 + 4) = 0;
    break;
  case 10:
  case 0xb:
    bVar1 = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>> *)&other->field_0;
    pbStack_78 = this;
    switch((byte)bVar1 & 0xf) {
    case 0:
    case 4:
      cVar8 = (other->field_0).common_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      goto LAB_005bdc04;
    case 1:
      bVar1 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
              (other->field_0).boolean_.val_;
      cVar8 = (other->field_0).common_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      this[2] = bVar1;
LAB_005bdc04:
      *(common_storage *)this = cVar8;
      break;
    default:
      uVar6 = *(undefined8 *)&other->field_0;
      iVar5 = (other->field_0).int64_.val_;
      iVar7 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar7;
      *(undefined8 *)this = uVar6;
      *(int64_t *)(this + 8) = iVar5;
      break;
    case 6:
      hVar4 = (other->field_0).half_float_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      *(half_storage *)this = hVar4;
      break;
    case 7:
      bVar2 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
              (other->field_0).common_.tag_;
      uVar9 = (ulong)((byte)bVar1 >> 2 & 0xfffffffc);
      memcpy(auStack_8c,(void *)((long)&other->field_0 + 4),uVar9);
      auStack_8c[(byte)bVar1 >> 4] = 0;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      *this = bVar1;
      this[1] = bVar2;
      memcpy(this + 4,auStack_8c,uVar9);
      *(undefined4 *)(this + (ulong)((byte)bVar1 >> 4) * 4 + 4) = 0;
      break;
    case 10:
    case 0xb:
      jVar3 = (other->field_0).json_const_pointer_;
      bVar1 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
              (other->field_0).common_.tag_;
      uVar9 = (ulong)((byte)jVar3 >> 4);
      pbStack_c0 = this;
      memcpy(auStack_cc,(void *)((long)&other->field_0 + 4),uVar9 * 4);
      auStack_cc[uVar9] = 0;
      (other->field_0).common_ = *(common_storage *)this;
      *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)jVar3;
      this[1] = bVar1;
      memcpy(this + 4,auStack_cc,uVar9 * 4);
      *(undefined4 *)(this + uVar9 * 4 + 4) = 0;
      return;
    case 0xc:
    case 0xd:
    case 0xe:
      bVar2 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
              (other->field_0).common_.tag_;
      iVar5 = (other->field_0).int64_.val_;
      iVar7 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar7;
      *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
              ((byte)bVar1 & 0xf);
      this[1] = bVar2;
      *(int64_t *)(this + 8) = iVar5;
      break;
    case 0xf:
      bVar1 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
              (other->field_0).common_.tag_;
      iVar5 = (other->field_0).int64_.val_;
      iVar7 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar7;
      *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)0xf;
      this[1] = bVar1;
      *(int64_t *)(this + 8) = iVar5;
    }
    return;
  case 0xc:
  case 0xd:
  case 0xe:
    bVar2 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
            (other->field_0).common_.tag_;
    iVar5 = (other->field_0).int64_.val_;
    iVar7 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar7;
    *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)((byte)bVar1 & 0xf)
    ;
    this[1] = bVar2;
    *(int64_t *)(this + 8) = iVar5;
    break;
  case 0xf:
    bVar1 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)
            (other->field_0).common_.tag_;
    iVar5 = (other->field_0).int64_.val_;
    iVar7 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar7;
    *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>)0xf;
    this[1] = bVar1;
    *(int64_t *)(this + 8) = iVar5;
  }
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }